

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.h
# Opt level: O0

void __thiscall slang::SVInt::SVInt(SVInt *this,bitwidth_t bits,uint64_t value,bool isSigned)

{
  bool bVar1;
  bool isSigned_local;
  uint64_t value_local;
  bitwidth_t bits_local;
  SVInt *this_local;
  
  SVIntStorage::SVIntStorage(&this->super_SVIntStorage,bits,isSigned,false);
  if ((bits != 0) && (bits < 0x1000000)) {
    bVar1 = isSingleWord(this);
    if (bVar1) {
      (this->super_SVIntStorage).field_0.val = value;
    }
    else {
      initSlowCase(this,value);
    }
    clearUnusedBits(this);
    return;
  }
  assert::assertFailed
            ("bits > 0 && bits <= MAX_BITS",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/numeric/SVInt.h"
             ,0xbc,"slang::SVInt::SVInt(bitwidth_t, uint64_t, bool)");
}

Assistant:

SVInt(bitwidth_t bits, uint64_t value, bool isSigned) : SVIntStorage(bits, isSigned, false) {
        ASSERT(bits > 0 && bits <= MAX_BITS);
        if (isSingleWord())
            val = value;
        else
            initSlowCase(value);
        clearUnusedBits();
    }